

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O2

size_t duckdb_zstd::FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  long lVar3;
  FSE_DTable *pFVar4;
  BYTE BVar5;
  size_t sVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  FSE_DState_t *DStatePtr;
  bool bVar11;
  size_t sStack_b0;
  BIT_DStream_t bitD;
  FSE_DState_t *local_68;
  uint local_60;
  uint tableLog;
  FSE_DTable *local_58;
  FSE_DState_t state1;
  FSE_DState_t local_40;
  
  if (bmi2 != 0) {
    sVar6 = FSE_decompress_wksp_body_bmi2(dst,dstCapacity,cSrc,cSrcSize,maxLog,workSpace,wkspSize);
    return sVar6;
  }
  local_60 = 0xff;
  if (wkspSize < 0x200) {
    sStack_b0 = 0xffffffffffffffff;
  }
  else {
    sVar6 = FSE_readNCount_bmi2((short *)workSpace,&local_60,&tableLog,cSrc,cSrcSize,0);
    sStack_b0 = sVar6;
    if (((sVar6 < 0xffffffffffffff89) && (sStack_b0 = 0xffffffffffffffd4, tableLog <= maxLog)) &&
       (lVar9 = (long)(1 << ((byte)tableLog & 0x1f)),
       ((1L << ((byte)tableLog & 0x3f)) + lVar9 * 4 + (ulong)(local_60 + 1) * 2 + 0x13 &
       0xfffffffffffffffc) + 0x204 <= wkspSize)) {
      local_58 = (FSE_DTable *)((long)workSpace + 0x200);
      sStack_b0 = FSE_buildDTable_internal
                            (local_58,(short *)workSpace,local_60,tableLog,local_58 + lVar9 + 1,
                             (wkspSize - (lVar9 * 4 + 4)) - 0x200);
      if (sStack_b0 < 0xffffffffffffff89) {
        pBVar2 = (BYTE *)((long)dst + (dstCapacity - 3));
        if (*(short *)((long)workSpace + 0x202) == 0) {
          sStack_b0 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar6),cSrcSize - sVar6);
          pFVar4 = local_58;
          if (sStack_b0 < 0xffffffffffffff89) {
            FSE_initDState(&state1,&bitD,local_58);
            FSE_initDState(&local_40,&bitD,pFVar4);
            lVar9 = 0;
            while (bitD.bitsConsumed < 0x41) {
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr == bitD.start) goto LAB_01beeeac;
                bVar11 = bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                uVar8 = (int)bitD.ptr - (int)bitD.start;
                if (bVar11) {
                  uVar8 = bitD.bitsConsumed >> 3;
                }
                bitD.bitsConsumed = bitD.bitsConsumed + uVar8 * -8;
              }
              else {
                uVar8 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bVar11 = true;
              }
              bitD.ptr = bitD.ptr + -(ulong)uVar8;
              pBVar1 = (BYTE *)((long)dst + lVar9);
              bitD.bitContainer = *(BitContainerType *)bitD.ptr;
              if ((pBVar2 <= pBVar1) || (!bVar11)) goto LAB_01beeeac;
              BVar5 = FSE_decodeSymbol(&state1,&bitD);
              *pBVar1 = BVar5;
              BVar5 = FSE_decodeSymbol(&local_40,&bitD);
              pBVar1[1] = BVar5;
              BVar5 = FSE_decodeSymbol(&state1,&bitD);
              pBVar1[2] = BVar5;
              BVar5 = FSE_decodeSymbol(&local_40,&bitD);
              pBVar1[3] = BVar5;
              lVar9 = lVar9 + 4;
            }
            bitD.ptr = "";
LAB_01beeeac:
            pBVar2 = (BYTE *)((long)dst + (dstCapacity - 2));
            DStatePtr = &local_40;
            for (; sStack_b0 = 0xffffffffffffffba, (BYTE *)((long)dst + lVar9) <= pBVar2;
                lVar9 = lVar9 + 2) {
              BVar5 = FSE_decodeSymbol(&state1,&bitD);
              *(BYTE *)((long)dst + lVar9) = BVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar9 + 1;
                lVar7 = 2;
LAB_01bef02b:
                bitD.ptr = "";
                BVar5 = FSE_decodeSymbol(DStatePtr,&bitD);
                *(BYTE *)((long)dst + lVar3) = BVar5;
                goto LAB_01bef048;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar8 = (int)bitD.ptr - (int)bitD.start;
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar8 = bitD.bitsConsumed >> 3;
                  }
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar8 * -8;
                  goto LAB_01beef43;
                }
              }
              else {
                uVar8 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
LAB_01beef43:
                bitD.ptr = bitD.ptr + -(ulong)uVar8;
                bitD.bitContainer = *(BitContainerType *)bitD.ptr;
              }
              pBVar1 = (BYTE *)((long)dst + lVar9 + 1);
              if (pBVar2 < pBVar1) {
                return 0xffffffffffffffba;
              }
              BVar5 = FSE_decodeSymbol(DStatePtr,&bitD);
              *pBVar1 = BVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar9 + 2;
                lVar7 = 3;
                DStatePtr = &state1;
                goto LAB_01bef02b;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar10 = (ulong)(uint)((int)bitD.ptr - (int)bitD.start);
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar10 = (ulong)(bitD.bitsConsumed >> 3);
                  }
                  bitD.ptr = bitD.ptr + -uVar10;
                  bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar10 * -8;
                  bitD.bitContainer = *(BitContainerType *)bitD.ptr;
                }
              }
              else {
                bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bitD.bitContainer = *(BitContainerType *)bitD.ptr;
              }
            }
          }
        }
        else {
          sStack_b0 = BIT_initDStream(&bitD,(void *)((long)cSrc + sVar6),cSrcSize - sVar6);
          pFVar4 = local_58;
          if (sStack_b0 < 0xffffffffffffff89) {
            FSE_initDState(&state1,&bitD,local_58);
            FSE_initDState(&local_40,&bitD,pFVar4);
            lVar9 = 0;
            while (bitD.bitsConsumed < 0x41) {
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr == bitD.start) goto LAB_01beecf0;
                bVar11 = bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                uVar8 = (int)bitD.ptr - (int)bitD.start;
                if (bVar11) {
                  uVar8 = bitD.bitsConsumed >> 3;
                }
                bitD.bitsConsumed = bitD.bitsConsumed + uVar8 * -8;
              }
              else {
                uVar8 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bVar11 = true;
              }
              bitD.ptr = bitD.ptr + -(ulong)uVar8;
              pBVar1 = (BYTE *)((long)dst + lVar9);
              bitD.bitContainer = *(BitContainerType *)bitD.ptr;
              if ((pBVar2 <= pBVar1) || (!bVar11)) goto LAB_01beecf0;
              BVar5 = FSE_decodeSymbolFast(&state1,&bitD);
              *pBVar1 = BVar5;
              BVar5 = FSE_decodeSymbolFast(&local_40,&bitD);
              pBVar1[1] = BVar5;
              BVar5 = FSE_decodeSymbolFast(&state1,&bitD);
              pBVar1[2] = BVar5;
              BVar5 = FSE_decodeSymbolFast(&local_40,&bitD);
              pBVar1[3] = BVar5;
              lVar9 = lVar9 + 4;
            }
            bitD.ptr = "";
LAB_01beecf0:
            pBVar2 = (BYTE *)((long)dst + (dstCapacity - 2));
            sStack_b0 = 0xffffffffffffffba;
            local_68 = &local_40;
            for (; (BYTE *)((long)dst + lVar9) <= pBVar2; lVar9 = lVar9 + 2) {
              BVar5 = FSE_decodeSymbolFast(&state1,&bitD);
              *(BYTE *)((long)dst + lVar9) = BVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar9 + 1;
                lVar7 = 2;
                goto LAB_01beee7d;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar8 = (int)bitD.ptr - (int)bitD.start;
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar8 = bitD.bitsConsumed >> 3;
                  }
                  bitD.bitsConsumed = bitD.bitsConsumed + uVar8 * -8;
                  goto LAB_01beed8d;
                }
              }
              else {
                uVar8 = bitD.bitsConsumed >> 3;
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
LAB_01beed8d:
                bitD.ptr = bitD.ptr + -(ulong)uVar8;
                bitD.bitContainer = *(BitContainerType *)bitD.ptr;
              }
              pBVar1 = (BYTE *)((long)dst + lVar9 + 1);
              if (pBVar2 < pBVar1) {
                return 0xffffffffffffffba;
              }
              BVar5 = FSE_decodeSymbolFast(&local_40,&bitD);
              *pBVar1 = BVar5;
              if (0x40 < bitD.bitsConsumed) {
                lVar3 = lVar9 + 2;
                lVar7 = 3;
                local_68 = &state1;
LAB_01beee7d:
                bitD.ptr = "";
                BVar5 = FSE_decodeSymbolFast(local_68,&bitD);
                *(BYTE *)((long)dst + lVar3) = BVar5;
LAB_01bef048:
                return lVar7 + lVar9;
              }
              if (bitD.ptr < bitD.limitPtr) {
                if (bitD.ptr != bitD.start) {
                  uVar10 = (ulong)(uint)((int)bitD.ptr - (int)bitD.start);
                  if (bitD.start <= bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3)) {
                    uVar10 = (ulong)(bitD.bitsConsumed >> 3);
                  }
                  bitD.ptr = bitD.ptr + -uVar10;
                  bitD.bitsConsumed = bitD.bitsConsumed + (int)uVar10 * -8;
                  bitD.bitContainer = *(BitContainerType *)bitD.ptr;
                }
              }
              else {
                bitD.ptr = bitD.ptr + -(ulong)(bitD.bitsConsumed >> 3);
                bitD.bitsConsumed = bitD.bitsConsumed & 7;
                bitD.bitContainer = *(BitContainerType *)bitD.ptr;
              }
            }
          }
        }
      }
    }
  }
  return sStack_b0;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}